

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

void lgx_value_type_print(lgx_value_t *v)

{
  undefined1 local_30 [8];
  lgx_str_t type_1;
  lgx_str_t type;
  lgx_value_t *v_local;
  
  switch(v->type) {
  case T_UNKNOWN:
    printf("unknown");
    break;
  case T_CUSTOM:
  case T_MAP:
  case T_STRUCT:
  case T_INTERFACE:
    break;
  case T_NULL:
    printf("null");
    break;
  case T_LONG:
    printf("int");
    break;
  case T_DOUBLE:
    printf("float");
    break;
  case T_BOOL:
    printf("bool");
    break;
  case T_STRING:
    printf("string");
    break;
  case T_ARRAY:
    type_1.buffer._4_4_ = 0;
    type_1.buffer._0_4_ = 0;
    lgx_type_to_string(&((v->v).gc)->type,(lgx_str_t *)&type_1.buffer);
    printf("%.*s",(ulong)type_1.buffer._4_4_,0);
    lgx_str_cleanup((lgx_str_t *)&type_1.buffer);
    break;
  case T_FUNCTION:
    local_30._4_4_ = 0;
    type_1.size = 0;
    type_1.length = 0;
    local_30._0_4_ = 0;
    lgx_type_to_string(&((v->v).gc)->type,(lgx_str_t *)local_30);
    printf("%.*s",(ulong)(uint)local_30._4_4_,type_1._0_8_);
    lgx_str_cleanup((lgx_str_t *)local_30);
  }
  return;
}

Assistant:

void lgx_value_type_print(lgx_value_t* v) {
    switch (v->type) {
        case T_UNKNOWN:
            printf("unknown");
            break;
        case T_LONG:
            printf("int");
            break;
        case T_DOUBLE:
            printf("float");
            break;
        case T_BOOL:
            printf("bool");
            break;
        case T_STRING:
            printf("string");
            break;
        case T_NULL:
            printf("null");
            break;
        case T_ARRAY:{
            lgx_str_t type;
            lgx_str_set_null(type);
            lgx_type_to_string(&v->v.arr->gc.type, &type);
            printf("%.*s", type.length, type.buffer);
            lgx_str_cleanup(&type);
            break;
        }
        case T_FUNCTION:{
            lgx_str_t type;
            lgx_str_set_null(type);
            lgx_type_to_string(&v->v.fun->gc.type, &type);
            printf("%.*s", type.length, type.buffer);
            lgx_str_cleanup(&type);
            break;
        }
        case T_CUSTOM:
        case T_MAP:
        case T_STRUCT:
        case T_INTERFACE:
            // TODO
            break;
        
    }
}